

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool mips_tr_breakpoint_check(DisasContextBase *dcbase,CPUState *cs,CPUBreakpoint *bp)

{
  int iVar1;
  TCGContext_conflict6 *tcg_ctx;
  TCGArg a2;
  uint uVar2;
  TCGTemp *local_18;
  
  tcg_ctx = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
  if ((TranslationBlock *)dcbase->pc_next != dcbase[1].tb) {
    tcg_gen_op2_mips64el
              (tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_ctx->cpu_pc + (long)tcg_ctx),
               (TCGArg)dcbase->pc_next);
    dcbase[1].tb = (TranslationBlock *)dcbase->pc_next;
  }
  iVar1 = (int)dcbase[2].pc_next;
  if (iVar1 != *(int *)((long)&dcbase[2].pc_next + 4)) {
    tcg_gen_op2_mips64el
              (tcg_ctx,INDEX_op_movi_i32,(TCGArg)(tcg_ctx->hflags + (long)tcg_ctx),(long)iVar1);
    uVar2 = (uint)dcbase[2].pc_next;
    *(uint *)((long)&dcbase[2].pc_next + 4) = uVar2;
    uVar2 = uVar2 & 0x803800;
    if (((uVar2 == 0x800) || (uVar2 == 0x1800)) || (uVar2 == 0x1000)) {
      a2._0_4_ = dcbase[2].is_jmp;
      a2._4_4_ = dcbase[2].num_insns;
      tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_ctx->btarget + (long)tcg_ctx),a2);
    }
  }
  dcbase->is_jmp = DISAS_NORETURN;
  local_18 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  tcg_gen_callN_mips64el(tcg_ctx,helper_raise_exception_debug_mips64el,(TCGTemp *)0x0,1,&local_18);
  dcbase->pc_next = dcbase->pc_next + 4;
  return true;
}

Assistant:

static bool mips_tr_breakpoint_check(DisasContextBase *dcbase, CPUState *cs,
                                     const CPUBreakpoint *bp)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    save_cpu_state(ctx, 1);
    ctx->base.is_jmp = DISAS_NORETURN;
    gen_helper_raise_exception_debug(tcg_ctx, tcg_ctx->cpu_env);
    /*
     * The address covered by the breakpoint must be included in
     * [tb->pc, tb->pc + tb->size) in order to for it to be
     * properly cleared -- thus we increment the PC here so that
     * the logic setting tb->size below does the right thing.
     */
    ctx->base.pc_next += 4;
    return true;
}